

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_common.c
# Opt level: O2

StringCache * stringcache_create(MOJOSHADER_malloc m,MOJOSHADER_free f,void *d)

{
  StringCache *pSVar1;
  StringBucket **__s;
  
  pSVar1 = (StringCache *)(*m)(0x28,d);
  if (pSVar1 != (StringCache *)0x0) {
    pSVar1->m = (MOJOSHADER_malloc)0x0;
    pSVar1->f = (MOJOSHADER_free)0x0;
    pSVar1->hashtable = (StringBucket **)0x0;
    *(undefined8 *)&pSVar1->table_size = 0;
    pSVar1->d = (void *)0x0;
    __s = (StringBucket **)(*m)(0x800,d);
    pSVar1->hashtable = __s;
    if (__s != (StringBucket **)0x0) {
      memset(__s,0,0x800);
      pSVar1->table_size = 0x100;
      pSVar1->m = m;
      pSVar1->f = f;
      pSVar1->d = d;
      return pSVar1;
    }
    (*f)(pSVar1,d);
  }
  return (StringCache *)0x0;
}

Assistant:

StringCache *stringcache_create(MOJOSHADER_malloc m, MOJOSHADER_free f, void *d)
{
    const uint32 initial_table_size = 256;
    const size_t tablelen = sizeof (StringBucket *) * initial_table_size;
    StringCache *cache = (StringCache *) m(sizeof (StringCache), d);
    if (!cache)
        return NULL;
    memset(cache, '\0', sizeof (StringCache));

    cache->hashtable = (StringBucket **) m(tablelen, d);
    if (!cache->hashtable)
    {
        f(cache, d);
        return NULL;
    } // if
    memset(cache->hashtable, '\0', tablelen);

    cache->table_size = initial_table_size;
    cache->m = m;
    cache->f = f;
    cache->d = d;
    return cache;
}